

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::PRE::InsertSymDefinitionInLandingPad
          (PRE *this,StackSym *sym,Loop *loop,Sym **objPtrCopyPropSym)

{
  Opnd *this_00;
  code *pcVar1;
  Loop *loop_00;
  bool bVar2;
  BOOLEAN BVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  SymOpnd *pSVar6;
  PropertySym *propertySym;
  BasicBlock *pBVar7;
  Value *pVVar8;
  Value *pVVar9;
  Instr *pIVar10;
  RegOpnd *this_01;
  StackSym *sym_00;
  PRE *this_02;
  GlobHashBucket local_58;
  Value *local_48;
  Loop *local_40;
  PRE *local_38;
  
  pIVar10 = (sym->field_5).m_instrDef;
  local_38 = this;
  if ((sym->field_0x18 & pIVar10 != (Instr *)0x0) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4552,"(sym->IsSingleDef())","sym->IsSingleDef()");
    if (!bVar2) goto LAB_0041f955;
    *puVar5 = 0;
    if ((sym->field_0x18 & 1) == 0) {
      pIVar10 = (Instr *)0x0;
    }
    else {
      pIVar10 = (sym->field_5).m_instrDef;
    }
  }
  bVar2 = IsPREInstrSequenceCandidateLoad(pIVar10->m_opcode);
  if (!bVar2) {
    return false;
  }
  this_00 = pIVar10->m_src1;
  bVar2 = IR::Opnd::IsSymOpnd(this_00);
  if (!bVar2) {
    bVar2 = IR::Opnd::IsRegOpnd(this_00);
    if (!bVar2) {
      return false;
    }
    this_01 = IR::Opnd::AsRegOpnd(this_00);
    sym_00 = IR::Opnd::GetStackSym(&this_01->super_Opnd);
    bVar2 = GlobOptBlockData::IsLive(&loop->landingPad->globOptData,&sym_00->super_Sym);
    if (bVar2) {
      *objPtrCopyPropSym = &sym_00->super_Sym;
    }
    else if ((((sym_00->field_0x18 & 1) != 0) && ((sym_00->field_5).m_instrDef != (Instr *)0x0)) &&
            (bVar2 = InsertSymDefinitionInLandingPad(local_38,sym_00,loop,objPtrCopyPropSym), !bVar2
            )) {
      return false;
    }
    bVar2 = OpCodeAttr::TempNumberTransfer(pIVar10->m_opcode);
    if ((!bVar2) || (bVar2 = OpCodeAttr::TempObjectTransfer(pIVar10->m_opcode), !bVar2)) {
      *objPtrCopyPropSym = &sym->super_Sym;
    }
    pIVar10 = IR::Instr::Copy(pIVar10,true);
    if (pIVar10->m_opcode == BytecodeArgOutCapture) {
      pIVar10->m_opcode = Ld_A;
    }
    InsertInstrInLandingPad(local_38,pIVar10,loop);
    return true;
  }
  pSVar6 = IR::Opnd::AsSymOpnd(this_00);
  if (pSVar6->m_sym->m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x455c,"(symDefInstrSrc1->AsSymOpnd()->m_sym->IsPropertySym())",
                       "symDefInstrSrc1->AsSymOpnd()->m_sym->IsPropertySym()");
    if (!bVar2) goto LAB_0041f955;
    *puVar5 = 0;
  }
  pSVar6 = IR::Opnd::AsSymOpnd(this_00);
  propertySym = Sym::AsPropertySym(pSVar6->m_sym);
  BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                    (local_38->candidates->candidatesBv,(propertySym->super_Sym).m_id);
  if (BVar3 == '\0') {
    return false;
  }
  pBVar7 = Loop::GetAnyTailBlock(loop);
  pVVar8 = GlobOptBlockData::FindValue(&pBVar7->globOptData,&propertySym->super_Sym);
  local_40 = loop;
  pVVar9 = GlobOptBlockData::FindValue(&loop->landingPad->globOptData,&propertySym->super_Sym);
  this_02 = local_38;
  if (pVVar8->valueNumber != pVVar9->valueNumber) {
    return false;
  }
  *objPtrCopyPropSym = pVVar8->valueInfo->symStore;
  BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                    (local_38->candidates->candidatesToProcess,(propertySym->super_Sym).m_id);
  loop_00 = local_40;
  if (BVar3 == '\0') {
    bVar2 = GlobOptBlockData::IsLive(&local_40->landingPad->globOptData,*objPtrCopyPropSym);
    if (!bVar2) {
      return false;
    }
    pIVar10 = IR::Instr::Copy(pIVar10,true);
    this_02 = local_38;
  }
  else {
    local_58.element = pVVar8;
    local_58.value = &propertySym->super_Sym;
    local_48 = pVVar8;
    BVar4 = PreloadPRECandidate(this_02,local_40,&local_58);
    if (BVar4 == 0) {
      return false;
    }
    BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                      (this_02->candidates->candidatesToProcess,(propertySym->super_Sym).m_id);
    if (BVar3 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4581,"(!candidates->candidatesToProcess->Test(propSym->m_id))",
                         "!candidates->candidatesToProcess->Test(propSym->m_id)");
      if (!bVar2) goto LAB_0041f955;
      *puVar5 = 0;
      this_02 = local_38;
    }
    bVar2 = GlobOptBlockData::IsLive
                      (&loop_00->landingPad->globOptData,local_48->valueInfo->symStore);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4582,
                         "(loop->landingPad->globOptData.IsLive(valueOnBackEdge->GetValueInfo()->GetSymStore()))"
                         ,
                         "loop->landingPad->globOptData.IsLive(valueOnBackEdge->GetValueInfo()->GetSymStore())"
                        );
      if (!bVar2) {
LAB_0041f955:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    pIVar10 = IR::Instr::Copy(pIVar10,true);
  }
  pIVar10 = InsertPropertySymPreloadInLandingPad(this_02,pIVar10,loop_00,propertySym);
  return pIVar10 != (Instr *)0x0;
}

Assistant:

bool
GlobOpt::PRE::InsertSymDefinitionInLandingPad(StackSym * sym, Loop * loop, Sym ** objPtrCopyPropSym)
{
    Assert(sym->IsSingleDef());
    IR::Instr * symDefInstr = sym->GetInstrDef();
    if (!GlobOpt::IsPREInstrSequenceCandidateLoad(symDefInstr->m_opcode))
    {
        return false;
    }

    IR::Opnd * symDefInstrSrc1 = symDefInstr->GetSrc1();
    if (symDefInstrSrc1->IsSymOpnd())
    {
        Assert(symDefInstrSrc1->AsSymOpnd()->m_sym->IsPropertySym());
        // $L1
        //      T1 = o.x  (v1|T3)
        //      T2 = T1.y (v2|T4) <-- T1 is not live in the loop landing pad
        //      jmp $L1

        // Trying to make T1 live in the landing pad

        // o.x
        PropertySym* propSym = symDefInstrSrc1->AsSymOpnd()->m_sym->AsPropertySym();

        if (candidates->candidatesBv->Test(propSym->m_id))
        {
            // If propsym is a PRE candidate, then it must have had the same value on all back edges.
            // So, just look up the value on one of the back edges.

            BasicBlock* loopTail = loop->GetAnyTailBlock();
            Value * valueOnBackEdge = loopTail->globOptData.FindValue(propSym);
            
            // If o.x is not invariant in the loop, we can't use the preloaded value of o.x.y in the landing pad
            Value * valueInLandingPad = loop->landingPad->globOptData.FindValue(propSym);
            if (valueOnBackEdge->GetValueNumber() != valueInLandingPad->GetValueNumber())
            {
                return false;
            }

            *objPtrCopyPropSym = valueOnBackEdge->GetValueInfo()->GetSymStore();

            if (candidates->candidatesToProcess->Test(propSym->m_id))
            {
                GlobHashBucket bucket;
                bucket.element = valueOnBackEdge;
                bucket.value = propSym;
                if (!PreloadPRECandidate(loop, &bucket))
                {
                    return false;
                }
                Assert(!candidates->candidatesToProcess->Test(propSym->m_id));
                Assert(loop->landingPad->globOptData.IsLive(valueOnBackEdge->GetValueInfo()->GetSymStore()));

                // Inserted T3 = o.x
                // Now, we want to 
                // 1. Insert T1 = o.x
                // 2. Insert T4 = T1.y
                // 3. Indentify T3 as the objptr copy prop sym for T1, and make T3.y live on the back-edges

                // #1 is done next. #2 and #3 are done as part of preloading T1.y

                // Insert T1 = o.x
                if (!InsertPropertySymPreloadInLandingPad(symDefInstr->Copy(), loop, propSym))
                {
                    return false;
                }
                return true;
            }
            else
            {
                // o.x was already processed as a PRE candidate. If we were successful in preloading o.x,
                // we can now insert T1 = o.x
                if (loop->landingPad->globOptData.IsLive(*objPtrCopyPropSym))
                {
                    // insert T1 = o.x
                    if (!InsertPropertySymPreloadInLandingPad(symDefInstr->Copy(), loop, propSym))
                    {
                        return false;
                    }
                    return true;
                }
                else
                {
                    return false;
                }
            }
        }
        else
        {
            return false;
        }
    }
    else if (symDefInstrSrc1->IsRegOpnd())
    {
        // T2 = T1
        // T3 = T2.y
        // trying to insert def of T2

        // T1
        StackSym * symDefInstrSrc1Sym = symDefInstrSrc1->AsRegOpnd()->GetStackSym();
        if (!loop->landingPad->globOptData.IsLive(symDefInstrSrc1Sym))
        {
            if (symDefInstrSrc1Sym->IsSingleDef())
            {
                if (!InsertSymDefinitionInLandingPad(symDefInstrSrc1Sym, loop, objPtrCopyPropSym))
                {
                    return false;
                }
            }
        }
        else
        {
            *objPtrCopyPropSym = symDefInstrSrc1Sym;
        }

        if (!(OpCodeAttr::TempNumberTransfer(symDefInstr->m_opcode) && OpCodeAttr::TempObjectTransfer(symDefInstr->m_opcode)))
        {
            *objPtrCopyPropSym = sym;
        }
        IR::Instr * instr = symDefInstr->Copy();
        if (instr->m_opcode == Js::OpCode::BytecodeArgOutCapture)
        {
            instr->m_opcode = Js::OpCode::Ld_A;
        }
        InsertInstrInLandingPad(instr, loop);
        return true;
    }
    else
    {
        return false;
    }
}